

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  XmlOutput *this_00;
  XmlOutput *this_01;
  XmlOutput *v;
  XmlOutput *toTag;
  XmlOutput *ch;
  XmlOutput *o;
  XmlOutput *this_02;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffeec0;
  QString *in_stack_ffffffffffffeec8;
  triState v_00;
  QStringList *in_stack_ffffffffffffeed0;
  QString *in_stack_ffffffffffffeed8;
  char *in_stack_ffffffffffffeef8;
  xml_output *in_stack_ffffffffffffef08;
  XmlOutput *in_stack_ffffffffffffef10;
  bool local_f29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeef8);
  tag(in_stack_ffffffffffffeed8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  QString::QString(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeef8);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  xformExceptionHandlingNET2005
            ((exceptionHandling)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
             (DotNET)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrS((char *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
        (char *)in_stack_ffffffffffffeec8);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  local_f29 = QString::isNull((QString *)0x278a3f);
  if (local_f29) {
    noxml();
  }
  else {
    QString::QString(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeef8);
    attr(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  }
  local_f29 = !local_f29;
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
        (int)in_stack_ffffffffffffeec8);
  v_00 = (triState)((ulong)in_stack_ffffffffffffeec8 >> 0x20);
  this_00 = XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,v_00);
  this_01 = XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)in_stack_ffffffffffffeed0,(triState)((ulong)this_01 >> 0x20));
  v = XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  toTag = XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrE((char *)v,(int)((ulong)this_01 >> 0x20),(int)this_01);
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  ch = XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  o = XmlOutput::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  attrX((char *)toTag,(QStringList *)v,(char *)this_01);
  this_02 = XmlOutput::operator<<(in_stack_ffffffffffffef10,(xml_output *)o);
  xformUsePrecompiledHeaderForNET2005((pchOption)((ulong)this_01 >> 0x20),(DotNET)this_01);
  XmlOutput::operator<<(this_02,(xml_output *)o);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(this_02,(xml_output *)o);
  attrE((char *)v,(int)((ulong)this_01 >> 0x20),(int)this_01);
  XmlOutput::operator<<(this_02,(xml_output *)o);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(this_02,(xml_output *)o);
  attrE((char *)v,(int)((ulong)this_01 >> 0x20),(int)this_01);
  XmlOutput::operator<<(this_02,(xml_output *)o);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(this_02,(xml_output *)o);
  QString::QString((QString *)this_01,(char *)ch);
  closetag((QString *)toTag);
  XmlOutput::operator<<(this_02,(xml_output *)o);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x278f02);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  if (local_f29) {
    QString::~QString((QString *)0x279005);
  }
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x279275);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27928f);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCCLCompilerTool)
        << attrX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories)
        << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
        << attrX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories)
        << attrS(_AssemblerListingLocation, tool.AssemblerListingLocation)
        << attrE(_AssemblerOutput, tool.AssemblerOutput, /*ifNot*/ asmListingNone)
        << attrE(_BasicRuntimeChecks, tool.BasicRuntimeChecks, /*ifNot*/ runtimeBasicCheckNone)
        << attrE(_BrowseInformation, tool.BrowseInformation, /*ifNot*/ brInfoNone)
        << attrS(_BrowseInformationFile, tool.BrowseInformationFile)
        << attrT(_BufferSecurityCheck, tool.BufferSecurityCheck)
        << attrE(_CallingConvention, tool.CallingConvention, /*ifNot*/ callConventionDefault)
        << attrE(_CompileAs, tool.CompileAs, compileAsDefault)
        << attrE(_CompileAsManaged, tool.CompileAsManaged, /*ifNot*/ managedDefault)
        << attrT(_CompileOnly, tool.CompileOnly)
        << attrE(_DebugInformationFormat, tool.DebugInformationFormat, /*ifNot*/ debugUnknown)
        << attrT(_Detect64BitPortabilityProblems, tool.Detect64BitPortabilityProblems)
        << attrT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
        << attrX(_DisableSpecificWarnings, tool.DisableSpecificWarnings)
        << attrE(_EnableEnhancedInstructionSet, tool.EnableEnhancedInstructionSet, /*ifnot*/ archNotSet)
        << attrT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
        << attrT(_EnableFunctionLevelLinking, tool.EnableFunctionLevelLinking)
        << attrT(_EnableIntrinsicFunctions, tool.EnableIntrinsicFunctions)
        << xformExceptionHandlingNET2005(tool.ExceptionHandling, tool.config->CompilerVersion)
        << attrT(_ExpandAttributedSource, tool.ExpandAttributedSource)
        << attrE(_FavorSizeOrSpeed, tool.FavorSizeOrSpeed, /*ifNot*/ favorNone)

        << attrE(_FloatingPointModel, tool.FloatingPointModel, /*ifNot*/ floatingPointNotSet)
        << attrT(_FloatingPointExceptions, tool.FloatingPointExceptions)

        << attrT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
        << attrX(_ForcedIncludeFiles, tool.ForcedIncludeFiles)
        << attrX(_ForcedUsingFiles, tool.ForcedUsingFiles)
        << attrE(_GeneratePreprocessedFile, tool.GeneratePreprocessedFile, /*ifNot*/ preprocessUnknown)
        << attrT(_GlobalOptimizations, tool.GlobalOptimizations)
        << attrT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
        << attrT(_ImproveFloatingPointConsistency, tool.ImproveFloatingPointConsistency)
        << attrE(_InlineFunctionExpansion, tool.InlineFunctionExpansion, /*ifNot*/ expandDefault)
        << attrT(_KeepComments, tool.KeepComments)
        << attrT(_MinimalRebuild, tool.MinimalRebuild)
        << attrS(_ObjectFile, tool.ObjectFile)
        << attrT(_OmitFramePointers, tool.OmitFramePointers)
        << attrT(_OpenMP, tool.OpenMP)
        << attrE(_Optimization, tool.Optimization, /*ifNot*/ optimizeDefault)
        << attrE(_OptimizeForProcessor, tool.OptimizeForProcessor, /*ifNot*/ procOptimizeBlended)
        << attrT(_OptimizeForWindowsApplication, tool.OptimizeForWindowsApplication)
        << attrS(_OutputFile, tool.OutputFile)
        << attrS(_PrecompiledHeaderFile, tool.PrecompiledHeaderFile)
        << attrS(_PrecompiledHeaderThrough, tool.PrecompiledHeaderThrough)
        << attrX(_PreprocessorDefinitions, tool.PreprocessorDefinitions)
        << (tool.ProgramDataBaseFileName.isNull() ? noxml() : attr(_ProgramDataBaseFileName, tool.ProgramDataBaseFileName))
        << attrE(_RuntimeLibrary, tool.RuntimeLibrary, /*ifNot*/ rtUnknown)
        << attrT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
        << attrT(_ShowIncludes, tool.ShowIncludes)
        << attrT(_SmallerTypeCheck, tool.SmallerTypeCheck)
        << attrT(_StringPooling, tool.StringPooling)
        << attrE(_StructMemberAlignment, tool.StructMemberAlignment, /*ifNot*/ alignNotSet)
        << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << attrT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
        << attrT(_TurnOffAssemblyGeneration, tool.TurnOffAssemblyGeneration)
        << attrT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
        << attrX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions)
        << xformUsePrecompiledHeaderForNET2005(tool.UsePrecompiledHeader, tool.config->CompilerVersion)
        << attrT(_WarnAsError, tool.WarnAsError)
        << attrE(_WarningLevel, tool.WarningLevel, /*ifNot*/ warningLevelUnknown)
        << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization)
        << attrE(_CompileForArchitecture, tool.CompileForArchitecture, /*ifNot*/ archUnknown)
        << attrT(_InterworkCalls, tool.InterworkCalls)

        << closetag(_Tool);
}